

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

vector<Instruction,_std::allocator<Instruction>_> * __thiscall
Server::ReceiveProgramVector
          (vector<Instruction,_std::allocator<Instruction>_> *__return_storage_ptr__,Server *this)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  int i;
  long lVar2;
  long lVar3;
  undefined8 local_38;
  int size;
  
  local_38 = in_RAX;
  sVar1 = recv(this->newsockfd,&local_38,4,0);
  this->n = (int)sVar1;
  if ((int)sVar1 < 0) {
    puts("ERROR in Server reading from Client\'s socket!");
  }
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            (__return_storage_ptr__,(long)(int)local_38,(allocator_type *)((long)&local_38 + 7));
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < (int)local_38; lVar2 = lVar2 + 1) {
    sVar1 = recv(this->newsockfd,
                 (void *)((long)((__return_storage_ptr__->
                                 super__Vector_base<Instruction,_std::allocator<Instruction>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->val + lVar3),0x28,0);
    this->n = (int)sVar1;
    if ((int)sVar1 < 0) {
      puts("ERROR in Server reading from Client\'s socket!");
    }
    lVar3 = lVar3 + 0x28;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<Instruction> Server::ReceiveProgramVector()
{
    int size;
    n = recv(newsockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR in Server reading from Client's socket!\n");
    
    std::vector<Instruction> V(size);

    for (int i = 0; i < size; i++)
    {
        n = recv(newsockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR in Server reading from Client's socket!\n");
    }
    return V;
}